

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O2

void __thiscall QWidgetLineControl::internalRedo(QWidgetLineControl *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  byte bVar6;
  
  bVar1 = isRedoAvailable(this);
  if (!bVar1) {
    return;
  }
  internalDeselect(this);
  while( true ) {
    iVar3 = *(int *)(this + 0xf4);
    if ((int)((ulong)(*(long *)(this + 0x100) - *(long *)(this + 0xf8)) >> 4) <= iVar3) break;
    *(int *)(this + 0xf4) = iVar3 + 1;
    pvVar4 = std::vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>
             ::operator[]((vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>
                           *)(this + 0xf8),(long)iVar3);
    switch(*(byte *)pvVar4 & 0xf) {
    case 1:
      QString::insert((longlong)(this + 0x18),(QChar)(char16_t)pvVar4->pos);
      iVar3 = pvVar4->pos + 1;
      break;
    case 2:
    case 3:
    case 4:
    case 5:
      QString::remove((longlong)(this + 0x18),(long)pvVar4->pos);
    case 0:
    case 6:
      *(undefined8 *)(this + 0x110) = *(undefined8 *)&pvVar4->selStart;
      iVar3 = pvVar4->pos;
      break;
    default:
      goto switchD_003f800d_default;
    }
    *(int *)(this + 0x40) = iVar3;
switchD_003f800d_default:
    if (*(int *)(this + 0xf4) <
        (int)((ulong)(*(long *)(this + 0x100) - *(long *)(this + 0xf8)) >> 4)) {
      pvVar5 = std::
               vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>::
               operator[]((vector<QWidgetLineControl::Command,_std::allocator<QWidgetLineControl::Command>_>
                           *)(this + 0xf8),(long)*(int *)(this + 0xf4));
      bVar2 = *(byte *)pvVar5 & 0xf;
      if ((((bVar2 != 0) && (bVar6 = *(byte *)pvVar4 & 0xf, bVar2 != bVar6)) && (bVar6 < 4)) &&
         ((bVar2 < 4 || (bVar6 == 0)))) break;
    }
  }
  this[0x50] = (QWidgetLineControl)((byte)this[0x50] | 0x40);
  emitCursorPositionChanged(this);
  return;
}

Assistant:

void QWidgetLineControl::internalRedo()
{
    if (!isRedoAvailable())
        return;
    internalDeselect();
    while (m_undoState < (int)m_history.size()) {
        Command& cmd = m_history[m_undoState++];
        switch (cmd.type) {
        case Insert:
            m_text.insert(cmd.pos, cmd.uc);
            m_cursor = cmd.pos + 1;
            break;
        case SetSelection:
            m_selstart = cmd.selStart;
            m_selend = cmd.selEnd;
            m_cursor = cmd.pos;
            break;
        case Remove:
        case Delete:
        case RemoveSelection:
        case DeleteSelection:
            m_text.remove(cmd.pos, 1);
            m_selstart = cmd.selStart;
            m_selend = cmd.selEnd;
            m_cursor = cmd.pos;
            break;
        case Separator:
            m_selstart = cmd.selStart;
            m_selend = cmd.selEnd;
            m_cursor = cmd.pos;
            break;
        }
        if (m_undoState < (int)m_history.size()) {
            Command& next = m_history[m_undoState];
            if (next.type != cmd.type && cmd.type < RemoveSelection && next.type != Separator
                 && (next.type < RemoveSelection || cmd.type == Separator))
                break;
        }
    }
    m_textDirty = true;
    emitCursorPositionChanged();
}